

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O0

SourceFile * __thiscall SourceFiles::lookupFile(SourceFiles *this,QMakeLocalFileName *f)

{
  long lVar1;
  SourceFile *pSVar2;
  char *in_RSI;
  SourceFiles *in_RDI;
  long in_FS_OFFSET;
  QMakeLocalFileName *in_stack_ffffffffffffffc0;
  SourceFiles *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QMakeLocalFileName::local(in_stack_ffffffffffffffc0);
  QString::toLatin1((QString *)in_RDI);
  QByteArray::constData((QByteArray *)0x1d009f);
  pSVar2 = lookupFile(this_00,in_RSI);
  QByteArray::~QByteArray((QByteArray *)0x1d00ba);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pSVar2;
  }
  __stack_chk_fail();
}

Assistant:

inline SourceFile *lookupFile(const QMakeLocalFileName &f) { return lookupFile(f.local().toLatin1().constData()); }